

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O0

int write_htimedelta(CPURISCVState_conflict2 *env,int csrno,target_ulong val)

{
  target_ulong val_local;
  int csrno_local;
  CPURISCVState_conflict2 *env_local;
  
  if (env->rdtime_fn == (_func_uint64_t *)0x0) {
    env_local._4_4_ = -1;
  }
  else {
    env->htimedelta = val;
    env_local._4_4_ = 0;
  }
  return env_local._4_4_;
}

Assistant:

static int write_htimedelta(CPURISCVState *env, int csrno, target_ulong val)
{
    if (!env->rdtime_fn) {
        return -1;
    }

#if defined(TARGET_RISCV32)
    env->htimedelta = deposit64(env->htimedelta, 0, 32, (uint64_t)val);
#else
    env->htimedelta = val;
#endif
    return 0;
}